

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

int32_t u_parseCodePoints(char *s,uint32_t *dest,int32_t destCapacity,UErrorCode *pErrorCode)

{
  byte bVar1;
  char *in_RAX;
  char *__nptr;
  ulong uVar2;
  ulong uVar3;
  UErrorCode UVar4;
  uint uVar5;
  char *end;
  
  uVar5 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar4 = U_ILLEGAL_ARGUMENT_ERROR;
    if ((destCapacity < 0 || s == (char *)0x0) || (dest == (uint32_t *)0x0 && destCapacity != 0)) {
LAB_0010b096:
      *pErrorCode = UVar4;
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      end = in_RAX;
      while( true ) {
        __nptr = u_skipWhitespace(s);
        if ((*__nptr == '\0') || (*__nptr == ';')) break;
        uVar2 = strtoul(__nptr,&end,0x10);
        if (end <= __nptr) {
LAB_0010b093:
          UVar4 = U_PARSE_ERROR;
          goto LAB_0010b096;
        }
        bVar1 = *end;
        if ((((0x3b < (ulong)bVar1) || ((0x800000100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
            (bVar1 != 0)) || (0x10ffff < (uint)uVar2)) goto LAB_0010b093;
        s = end;
        if ((int)uVar5 < destCapacity) {
          uVar3 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          dest[uVar3] = (uint)uVar2;
        }
        else {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePoints(const char *s,
                  uint32_t *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;
    int32_t count;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    count=0;
    for(;;) {
        s=u_skipWhitespace(s);
        if(*s==';' || *s==0) {
            return count;
        }

        /* read one code point */
        value=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || (!U_IS_INV_WHITESPACE(*end) && *end!=';' && *end!=0) || value>=0x110000) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }

        /* append it to the destination array */
        if(count<destCapacity) {
            dest[count++]=value;
        } else {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        }

        /* go to the following characters */
        s=end;
    }
}